

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Raytracer.cpp
# Opt level: O3

ostream * operator<<(ostream *os,Raytracer *raytracer)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Raytracer {",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(os,"imgWidth: ",10);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,raytracer->imgWidth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," imgHeight: ",0xc);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,raytracer->imgHeight);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," camera: ",9);
  poVar1 = operator<<(poVar1,&raytracer->camera);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," backgroundColor: ",0x12);
  poVar1 = operator<<(poVar1,&raytracer->backgroundColor);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Raytracer &raytracer) {
    os << "Raytracer {"<<"imgWidth: " << raytracer.imgWidth << " imgHeight: " << raytracer.imgHeight
       << " camera: " << raytracer.camera << " backgroundColor: " << raytracer.backgroundColor<<std::endl<<"}"<<std::endl;
    return os;
}